

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChLinePath::EraseSubLine(ChLinePath *this,size_t n)

{
  pointer pdVar1;
  pointer psVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pdVar5;
  long lVar6;
  pointer pdVar7;
  double dVar8;
  
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::_M_erase(&this->lines,
             (this->lines).
             super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
             ._M_impl.super__Vector_impl_data._M_start + n);
  pdVar1 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = pdVar1 + n + 1;
  if (pdVar5 != pdVar7) {
    memmove(pdVar1 + n,pdVar5,(long)pdVar7 - (long)pdVar5);
    pdVar7 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar7 + -1;
  psVar2 = (this->lines).
           super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar5 = (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar5;
  if (psVar2 != (this->lines).
                super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    pdVar3 = (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)pdVar5 - (long)pdVar3;
    if (lVar6 != 0) {
      pdVar4 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 >> 3;
      dVar8 = 0.0;
      do {
        dVar8 = dVar8 + *pdVar4;
        lVar6 = lVar6 + -1;
        *pdVar3 = dVar8;
      } while (lVar6 != 0);
    }
  }
  return;
}

Assistant:

void ChLinePath::EraseSubLine(size_t n) {
    lines.erase(lines.begin() + n);
    durations.erase(durations.begin() + n);
    end_times.pop_back();
    // force recompute all end times:
    if (lines.size())
        SetSubLineDurationN(0, durations[0]);
}